

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  undefined4 *puVar27;
  undefined4 *puVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar33;
  int iVar34;
  undefined8 uVar35;
  Ref<embree::Geometry> *pRVar36;
  Geometry *pGVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  RTCIntersectArguments *pRVar41;
  RTCRayQueryContext *pRVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  undefined1 (*pauVar47) [16];
  uint uVar48;
  int iVar49;
  undefined4 uVar50;
  AABBNodeMB4D *node1;
  ulong uVar51;
  long lVar52;
  RayHit *pRVar53;
  Scene *pSVar54;
  int *piVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  undefined4 uVar59;
  ulong in_R10;
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  float fVar65;
  float fVar66;
  float fVar80;
  float fVar82;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar81;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  float fVar97;
  uint uVar98;
  float fVar101;
  float fVar102;
  uint uVar103;
  float fVar104;
  float fVar105;
  uint uVar106;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar107;
  float fVar108;
  uint uVar109;
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar117;
  float fVar124;
  float fVar125;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar130;
  float fVar134;
  float fVar136;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar135;
  float fVar137;
  undefined1 auVar133 [16];
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar139 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 (*local_12c0) [16];
  int local_12ac;
  undefined1 local_12a8 [16];
  RayHit *local_1290;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  Scene *local_1260;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  RTCFilterFunctionNArguments local_1248;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float local_1208;
  float local_1204;
  float local_1200;
  float local_11fc;
  undefined4 local_11f8;
  undefined4 local_11f4;
  uint local_11f0;
  uint local_11ec;
  uint local_11e8;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined4 uStack_11b8;
  undefined4 uStack_11b4;
  ulong local_11b0;
  undefined1 local_11a8 [8];
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  undefined1 local_1188 [8];
  float fStack_1180;
  float fStack_117c;
  undefined1 local_1178 [16];
  undefined1 local_1158 [16];
  float local_1148 [4];
  undefined1 local_1138 [8];
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  undefined1 local_1118 [8];
  float fStack_1110;
  float fStack_110c;
  float local_1108 [4];
  float local_10f8 [4];
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined8 local_1088;
  ulong local_1080;
  ulong local_1078;
  ulong local_1070;
  ulong local_1068;
  ulong local_1060;
  ulong local_1058;
  ulong local_1050;
  ulong local_1048;
  ulong local_1040;
  ulong local_1038;
  ulong local_1030;
  ulong local_1028;
  ulong local_1020;
  ulong local_1018;
  long local_1010;
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  float fStack_f80;
  float fStack_f7c;
  undefined8 local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_12c0 = (undefined1 (*) [16])local_f68;
      local_ff8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_f98 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_fc8 = (ray->super_RayK<1>).org.field_0.m128[2];
      aVar33 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar134 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_fd8 = 0.0;
      if (0.0 <= fVar134) {
        local_fd8 = fVar134;
      }
      fVar134 = (ray->super_RayK<1>).tfar;
      fVar110 = 0.0;
      if (0.0 <= fVar134) {
        fVar110 = fVar134;
      }
      auVar67._4_4_ = -(uint)(ABS(aVar33.y) < DAT_01ff1d40._4_4_);
      auVar67._0_4_ = -(uint)(ABS(aVar33.x) < (float)DAT_01ff1d40);
      auVar67._8_4_ = -(uint)(ABS(aVar33.z) < DAT_01ff1d40._8_4_);
      auVar67._12_4_ = -(uint)(ABS(aVar33.field_3.w) < DAT_01ff1d40._12_4_);
      auVar111 = blendvps((undefined1  [16])aVar33,_DAT_01ff1d40,auVar67);
      auVar67 = rcpps(auVar67,auVar111);
      local_fa8 = auVar67._0_4_;
      fVar134 = auVar67._4_4_;
      local_fe8 = auVar67._8_4_;
      local_fa8 = (1.0 - auVar111._0_4_ * local_fa8) * local_fa8 + local_fa8;
      fVar134 = (1.0 - auVar111._4_4_ * fVar134) * fVar134 + fVar134;
      local_fe8 = (1.0 - auVar111._8_4_ * local_fe8) * local_fe8 + local_fe8;
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      local_fb8._4_4_ = fVar134;
      local_fb8._0_4_ = fVar134;
      fStack_fb0 = fVar134;
      fStack_fac = fVar134;
      local_1058 = (ulong)(local_fa8 < 0.0) << 4;
      local_1060 = (ulong)(fVar134 < 0.0) << 4 | 0x20;
      local_1068 = (ulong)(local_fe8 < 0.0) << 4 | 0x40;
      local_1070 = local_1058 ^ 0x10;
      local_1078 = local_1060 ^ 0x10;
      local_1080 = local_1068 ^ 0x10;
      auVar111._4_4_ = fVar110;
      auVar111._0_4_ = fVar110;
      auVar111._8_4_ = fVar110;
      auVar111._12_4_ = fVar110;
      local_1290 = ray;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      _local_1008 = mm_lookupmask_ps._240_8_;
      _uStack_1000 = mm_lookupmask_ps._248_8_;
      fVar134 = local_fc8;
      fVar110 = local_fc8;
      fVar150 = local_fc8;
      fVar86 = local_fc8;
      fVar96 = local_fd8;
      fVar101 = local_fd8;
      fVar104 = local_fd8;
      fVar107 = local_fd8;
      fVar159 = local_fe8;
      fVar160 = local_fe8;
      fVar161 = local_fe8;
      fVar162 = local_fe8;
      fVar65 = local_ff8;
      fVar66 = local_ff8;
      fVar80 = local_ff8;
      fVar81 = local_ff8;
      do {
        do {
          do {
            if (local_12c0 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar47 = local_12c0 + -1;
            local_12c0 = local_12c0 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar47 + 8));
          uVar64 = *(ulong *)*local_12c0;
          do {
            if ((uVar64 & 8) == 0) {
              fVar82 = (ray->super_RayK<1>).dir.field_0.m128[3];
              uVar51 = uVar64 & 0xfffffffffffffff0;
              pfVar30 = (float *)(uVar51 + 0x80 + local_1058);
              pfVar25 = (float *)(uVar51 + 0x20 + local_1058);
              auVar123._0_4_ = ((*pfVar30 * fVar82 + *pfVar25) - fVar65) * local_fa8;
              auVar123._4_4_ = ((pfVar30[1] * fVar82 + pfVar25[1]) - fVar66) * fStack_fa4;
              auVar123._8_4_ = ((pfVar30[2] * fVar82 + pfVar25[2]) - fVar80) * fStack_fa0;
              auVar123._12_4_ = ((pfVar30[3] * fVar82 + pfVar25[3]) - fVar81) * fStack_f9c;
              auVar119._4_4_ = fVar101;
              auVar119._0_4_ = fVar96;
              auVar119._8_4_ = fVar104;
              auVar119._12_4_ = fVar107;
              pfVar30 = (float *)(uVar51 + 0x80 + local_1060);
              pfVar25 = (float *)(uVar51 + 0x20 + local_1060);
              auVar67 = maxps(auVar119,auVar123);
              auVar118._0_4_ = ((*pfVar30 * fVar82 + *pfVar25) - local_f98) * (float)local_fb8._0_4_
              ;
              auVar118._4_4_ =
                   ((pfVar30[1] * fVar82 + pfVar25[1]) - fStack_f94) * (float)local_fb8._4_4_;
              auVar118._8_4_ = ((pfVar30[2] * fVar82 + pfVar25[2]) - fStack_f90) * fStack_fb0;
              auVar118._12_4_ = ((pfVar30[3] * fVar82 + pfVar25[3]) - fStack_f8c) * fStack_fac;
              pfVar30 = (float *)(uVar51 + 0x80 + local_1068);
              pfVar25 = (float *)(uVar51 + 0x20 + local_1068);
              auVar129._0_4_ = ((*pfVar30 * fVar82 + *pfVar25) - fVar134) * fVar159;
              auVar129._4_4_ = ((pfVar30[1] * fVar82 + pfVar25[1]) - fVar110) * fVar160;
              auVar129._8_4_ = ((pfVar30[2] * fVar82 + pfVar25[2]) - fVar150) * fVar161;
              auVar129._12_4_ = ((pfVar30[3] * fVar82 + pfVar25[3]) - fVar86) * fVar162;
              auVar119 = maxps(auVar118,auVar129);
              _local_11a8 = maxps(auVar67,auVar119);
              pfVar31 = (float *)(uVar51 + 0x80 + local_1070);
              pfVar25 = (float *)(uVar51 + 0x20 + local_1070);
              pfVar32 = (float *)(uVar51 + 0x80 + local_1078);
              pfVar30 = (float *)(uVar51 + 0x20 + local_1078);
              auVar120._0_4_ = ((*pfVar31 * fVar82 + *pfVar25) - fVar65) * local_fa8;
              auVar120._4_4_ = ((pfVar31[1] * fVar82 + pfVar25[1]) - fVar66) * fStack_fa4;
              auVar120._8_4_ = ((pfVar31[2] * fVar82 + pfVar25[2]) - fVar80) * fStack_fa0;
              auVar120._12_4_ = ((pfVar31[3] * fVar82 + pfVar25[3]) - fVar81) * fStack_f9c;
              auVar127._0_4_ = ((*pfVar32 * fVar82 + *pfVar30) - local_f98) * (float)local_fb8._0_4_
              ;
              auVar127._4_4_ =
                   ((pfVar32[1] * fVar82 + pfVar30[1]) - fStack_f94) * (float)local_fb8._4_4_;
              auVar127._8_4_ = ((pfVar32[2] * fVar82 + pfVar30[2]) - fStack_f90) * fStack_fb0;
              auVar127._12_4_ = ((pfVar32[3] * fVar82 + pfVar30[3]) - fStack_f8c) * fStack_fac;
              pfVar30 = (float *)(uVar51 + 0x80 + local_1080);
              pfVar25 = (float *)(uVar51 + 0x20 + local_1080);
              auVar132._0_4_ = ((*pfVar30 * fVar82 + *pfVar25) - fVar134) * fVar159;
              auVar132._4_4_ = ((pfVar30[1] * fVar82 + pfVar25[1]) - fVar110) * fVar160;
              auVar132._8_4_ = ((pfVar30[2] * fVar82 + pfVar25[2]) - fVar150) * fVar161;
              auVar132._12_4_ = ((pfVar30[3] * fVar82 + pfVar25[3]) - fVar86) * fVar162;
              auVar119 = minps(auVar127,auVar132);
              auVar67 = minps(auVar111,auVar120);
              auVar67 = minps(auVar67,auVar119);
              if (((uint)uVar64 & 7) == 6) {
                bVar43 = (fVar82 < *(float *)(uVar51 + 0xf0) && *(float *)(uVar51 + 0xe0) <= fVar82)
                         && local_11a8._0_4_ <= auVar67._0_4_;
                bVar44 = (fVar82 < *(float *)(uVar51 + 0xf4) && *(float *)(uVar51 + 0xe4) <= fVar82)
                         && local_11a8._4_4_ <= auVar67._4_4_;
                bVar45 = (fVar82 < *(float *)(uVar51 + 0xf8) && *(float *)(uVar51 + 0xe8) <= fVar82)
                         && local_11a8._8_4_ <= auVar67._8_4_;
                bVar46 = (fVar82 < *(float *)(uVar51 + 0xfc) && *(float *)(uVar51 + 0xec) <= fVar82)
                         && local_11a8._12_4_ <= auVar67._12_4_;
              }
              else {
                bVar43 = local_11a8._0_4_ <= auVar67._0_4_;
                bVar44 = local_11a8._4_4_ <= auVar67._4_4_;
                bVar45 = local_11a8._8_4_ <= auVar67._8_4_;
                bVar46 = local_11a8._12_4_ <= auVar67._12_4_;
              }
              auVar68._0_4_ = (uint)bVar43 * -0x80000000;
              auVar68._4_4_ = (uint)bVar44 * -0x80000000;
              auVar68._8_4_ = (uint)bVar45 * -0x80000000;
              auVar68._12_4_ = (uint)bVar46 * -0x80000000;
              uVar59 = movmskps((int)in_R10,auVar68);
              in_R10 = CONCAT44((int)(in_R10 >> 0x20),uVar59);
            }
            if ((uVar64 & 8) == 0) {
              if (in_R10 == 0) {
                iVar49 = 4;
              }
              else {
                uVar51 = uVar64 & 0xfffffffffffffff0;
                lVar52 = 0;
                if (in_R10 != 0) {
                  for (; (in_R10 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
                  }
                }
                iVar49 = 0;
                uVar64 = *(ulong *)(uVar51 + lVar52 * 8);
                uVar58 = in_R10 - 1 & in_R10;
                if (uVar58 != 0) {
                  uVar48 = *(uint *)(local_11a8 + lVar52 * 4);
                  lVar52 = 0;
                  if (uVar58 != 0) {
                    for (; (uVar58 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
                    }
                  }
                  uVar56 = *(ulong *)(uVar51 + lVar52 * 8);
                  uVar98 = *(uint *)(local_11a8 + lVar52 * 4);
                  uVar58 = uVar58 - 1 & uVar58;
                  if (uVar58 == 0) {
                    if (uVar48 < uVar98) {
                      *(ulong *)*local_12c0 = uVar56;
                      *(uint *)((long)*local_12c0 + 8) = uVar98;
                      local_12c0 = local_12c0 + 1;
                    }
                    else {
                      *(ulong *)*local_12c0 = uVar64;
                      *(uint *)((long)*local_12c0 + 8) = uVar48;
                      uVar64 = uVar56;
                      local_12c0 = local_12c0 + 1;
                    }
                  }
                  else {
                    auVar99._8_4_ = uVar48;
                    auVar99._0_8_ = uVar64;
                    auVar99._12_4_ = 0;
                    auVar121._8_4_ = uVar98;
                    auVar121._0_8_ = uVar56;
                    auVar121._12_4_ = 0;
                    lVar52 = 0;
                    if (uVar58 != 0) {
                      for (; (uVar58 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
                      }
                    }
                    uVar35 = *(undefined8 *)(uVar51 + lVar52 * 8);
                    iVar34 = *(int *)(local_11a8 + lVar52 * 4);
                    auVar112._8_4_ = iVar34;
                    auVar112._0_8_ = uVar35;
                    auVar112._12_4_ = 0;
                    auVar69._8_4_ = -(uint)((int)uVar48 < (int)uVar98);
                    uVar58 = uVar58 - 1 & uVar58;
                    iVar49 = 0;
                    if (uVar58 == 0) {
                      auVar69._4_4_ = auVar69._8_4_;
                      auVar69._0_4_ = auVar69._8_4_;
                      auVar69._12_4_ = auVar69._8_4_;
                      auVar128._8_4_ = uVar98;
                      auVar128._0_8_ = uVar56;
                      auVar128._12_4_ = 0;
                      auVar119 = blendvps(auVar128,auVar99,auVar69);
                      auVar67 = blendvps(auVar99,auVar121,auVar69);
                      auVar70._8_4_ = -(uint)(auVar119._8_4_ < iVar34);
                      auVar70._4_4_ = auVar70._8_4_;
                      auVar70._0_4_ = auVar70._8_4_;
                      auVar70._12_4_ = auVar70._8_4_;
                      auVar122._8_4_ = iVar34;
                      auVar122._0_8_ = uVar35;
                      auVar122._12_4_ = 0;
                      auVar123 = blendvps(auVar122,auVar119,auVar70);
                      auVar129 = blendvps(auVar119,auVar112,auVar70);
                      auVar71._8_4_ = -(uint)(auVar67._8_4_ < auVar129._8_4_);
                      auVar71._4_4_ = auVar71._8_4_;
                      auVar71._0_4_ = auVar71._8_4_;
                      auVar71._12_4_ = auVar71._8_4_;
                      auVar119 = blendvps(auVar129,auVar67,auVar71);
                      auVar67 = blendvps(auVar67,auVar129,auVar71);
                      *local_12c0 = auVar67;
                      local_12c0[1] = auVar119;
                      uVar64 = auVar123._0_8_;
                      local_12c0 = local_12c0 + 2;
                    }
                    else {
                      lVar52 = 0;
                      if (uVar58 != 0) {
                        for (; (uVar58 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
                        }
                      }
                      auVar72._4_4_ = auVar69._8_4_;
                      auVar72._0_4_ = auVar69._8_4_;
                      auVar72._8_4_ = auVar69._8_4_;
                      auVar72._12_4_ = auVar69._8_4_;
                      auVar129 = blendvps(auVar121,auVar99,auVar72);
                      auVar67 = blendvps(auVar99,auVar121,auVar72);
                      auVar131._8_4_ = *(int *)(local_11a8 + lVar52 * 4);
                      auVar131._0_8_ = *(undefined8 *)(uVar51 + lVar52 * 8);
                      auVar131._12_4_ = 0;
                      auVar73._8_4_ = -(uint)(iVar34 < *(int *)(local_11a8 + lVar52 * 4));
                      auVar73._4_4_ = auVar73._8_4_;
                      auVar73._0_4_ = auVar73._8_4_;
                      auVar73._12_4_ = auVar73._8_4_;
                      auVar123 = blendvps(auVar131,auVar112,auVar73);
                      auVar119 = blendvps(auVar112,auVar131,auVar73);
                      auVar74._8_4_ = -(uint)(auVar67._8_4_ < auVar119._8_4_);
                      auVar74._4_4_ = auVar74._8_4_;
                      auVar74._0_4_ = auVar74._8_4_;
                      auVar74._12_4_ = auVar74._8_4_;
                      auVar132 = blendvps(auVar119,auVar67,auVar74);
                      auVar67 = blendvps(auVar67,auVar119,auVar74);
                      auVar75._8_4_ = -(uint)(auVar129._8_4_ < auVar123._8_4_);
                      auVar75._4_4_ = auVar75._8_4_;
                      auVar75._0_4_ = auVar75._8_4_;
                      auVar75._12_4_ = auVar75._8_4_;
                      auVar119 = blendvps(auVar123,auVar129,auVar75);
                      auVar129 = blendvps(auVar129,auVar123,auVar75);
                      auVar76._8_4_ = -(uint)(auVar129._8_4_ < auVar132._8_4_);
                      auVar76._4_4_ = auVar76._8_4_;
                      auVar76._0_4_ = auVar76._8_4_;
                      auVar76._12_4_ = auVar76._8_4_;
                      auVar123 = blendvps(auVar132,auVar129,auVar76);
                      auVar129 = blendvps(auVar129,auVar132,auVar76);
                      *local_12c0 = auVar67;
                      local_12c0[1] = auVar129;
                      local_12c0[2] = auVar123;
                      uVar64 = auVar119._0_8_;
                      local_12c0 = local_12c0 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar49 = 6;
            }
          } while (iVar49 == 0);
        } while (iVar49 != 6);
        local_1088 = (ulong)((uint)uVar64 & 0xf) - 8;
        if (local_1088 != 0) {
          uVar64 = uVar64 & 0xfffffffffffffff0;
          local_1010 = 0;
          local_11b0 = in_R10;
          do {
            lVar52 = local_1010 * 0x60;
            pSVar54 = context->scene;
            local_1260 = pSVar54;
            pRVar36 = (pSVar54->geometries).items;
            pGVar37 = pRVar36[*(uint *)(uVar64 + 0x40 + lVar52)].ptr;
            fVar134 = (pGVar37->time_range).lower;
            fVar110 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar134) /
                      ((pGVar37->time_range).upper - fVar134)) * pGVar37->fnumTimeSegments;
            auVar100 = roundss(ZEXT816(0),ZEXT416((uint)fVar110),9);
            fVar134 = pGVar37->fnumTimeSegments + -1.0;
            if (fVar134 <= auVar100._0_4_) {
              auVar100._0_4_ = fVar134;
            }
            fVar134 = 0.0;
            if (0.0 <= auVar100._0_4_) {
              fVar134 = auVar100._0_4_;
            }
            lVar60 = (long)(int)fVar134 * 0x38;
            lVar38 = *(long *)(*(long *)&pGVar37[2].numPrimitives + lVar60);
            local_1050 = (ulong)*(uint *)(uVar64 + 4 + lVar52);
            pfVar25 = (float *)(lVar38 + (ulong)*(uint *)(uVar64 + lVar52) * 4);
            local_1030 = (ulong)*(uint *)(uVar64 + 0x10 + lVar52);
            pfVar30 = (float *)(lVar38 + local_1030 * 4);
            local_1020 = (ulong)*(uint *)(uVar64 + 0x20 + lVar52);
            pfVar31 = (float *)(lVar38 + local_1020 * 4);
            uVar48 = *(uint *)(uVar64 + 0x30 + lVar52);
            pfVar32 = (float *)(lVar38 + (ulong)uVar48 * 4);
            lVar38 = *(long *)&pRVar36[*(uint *)(uVar64 + 0x44 + lVar52)].ptr[2].numPrimitives;
            lVar39 = *(long *)(lVar38 + lVar60);
            pfVar1 = (float *)(lVar39 + local_1050 * 4);
            local_1040 = (ulong)*(uint *)(uVar64 + 0x14 + lVar52);
            pfVar2 = (float *)(lVar39 + local_1040 * 4);
            local_1028 = (ulong)*(uint *)(uVar64 + 0x24 + lVar52);
            pfVar3 = (float *)(lVar39 + local_1028 * 4);
            local_1018 = (ulong)*(uint *)(uVar64 + 0x34 + lVar52);
            pfVar4 = (float *)(lVar39 + local_1018 * 4);
            lVar39 = *(long *)&pRVar36[*(uint *)(uVar64 + 0x48 + lVar52)].ptr[2].numPrimitives;
            lVar40 = *(long *)(lVar39 + lVar60);
            uVar51 = (ulong)*(uint *)(uVar64 + 8 + lVar52);
            pfVar5 = (float *)(lVar40 + uVar51 * 4);
            uVar62 = (ulong)*(uint *)(uVar64 + 0x18 + lVar52);
            puVar6 = (undefined4 *)(lVar40 + uVar62 * 4);
            local_1048 = (ulong)*(uint *)(uVar64 + 0x28 + lVar52);
            puVar7 = (undefined4 *)(lVar40 + local_1048 * 4);
            local_1038 = (ulong)*(uint *)(uVar64 + 0x38 + lVar52);
            pfVar8 = (float *)(lVar40 + local_1038 * 4);
            fVar110 = fVar110 - fVar134;
            lVar40 = *(long *)&pRVar36[*(uint *)(uVar64 + 0x4c + lVar52)].ptr[2].numPrimitives;
            lVar60 = *(long *)(lVar40 + lVar60);
            uVar57 = (ulong)*(uint *)(uVar64 + 0xc + lVar52);
            pfVar26 = (float *)(lVar60 + uVar57 * 4);
            uVar61 = (ulong)*(uint *)(uVar64 + 0x1c + lVar52);
            puVar27 = (undefined4 *)(lVar60 + uVar61 * 4);
            uVar56 = (ulong)*(uint *)(uVar64 + 0x2c + lVar52);
            puVar28 = (undefined4 *)(lVar60 + uVar56 * 4);
            uVar58 = (ulong)*(uint *)(uVar64 + 0x3c + lVar52);
            pfVar29 = (float *)(lVar60 + uVar58 * 4);
            local_1088 = CONCAT44(*puVar27,*puVar6);
            lVar63 = (long)((int)fVar134 + 1) * 0x38;
            lVar60 = *(long *)(*(long *)&pGVar37[2].numPrimitives + lVar63);
            pfVar9 = (float *)(lVar60 + (ulong)*(uint *)(uVar64 + lVar52) * 4);
            local_1248.valid = (int *)CONCAT44(puVar28[2],puVar7[2]);
            uStack_11b8 = *puVar7;
            uStack_11b4 = *puVar28;
            lVar39 = *(long *)(lVar39 + lVar63);
            pfVar10 = (float *)(lVar39 + uVar51 * 4);
            local_f88 = CONCAT44(pfVar4[2],pfVar32[2]);
            local_f78._4_4_ = pfVar29[2];
            local_f78._0_4_ = pfVar8[2];
            lVar38 = *(long *)(lVar38 + lVar63);
            pfVar11 = (float *)(lVar38 + local_1050 * 4);
            lVar40 = *(long *)(lVar40 + lVar63);
            pfVar12 = (float *)(lVar40 + uVar57 * 4);
            pfVar13 = (float *)(lVar60 + local_1030 * 4);
            pfVar14 = (float *)(lVar39 + uVar62 * 4);
            pfVar15 = (float *)(lVar38 + local_1040 * 4);
            pfVar16 = (float *)(lVar40 + uVar61 * 4);
            pfVar17 = (float *)(lVar60 + local_1020 * 4);
            pfVar18 = (float *)(lVar39 + local_1048 * 4);
            pfVar19 = (float *)(lVar38 + local_1028 * 4);
            pfVar20 = (float *)(lVar40 + uVar56 * 4);
            pfVar21 = (float *)(lVar60 + (ulong)uVar48 * 4);
            pfVar22 = (float *)(lVar39 + local_1038 * 4);
            pfVar23 = (float *)(lVar38 + local_1018 * 4);
            pfVar24 = (float *)(lVar40 + uVar58 * 4);
            fVar134 = 1.0 - fVar110;
            fVar65 = *pfVar25 * fVar134 + *pfVar9 * fVar110;
            fVar80 = *pfVar1 * fVar134 + *pfVar11 * fVar110;
            fVar82 = *pfVar5 * fVar134 + *pfVar10 * fVar110;
            fVar84 = *pfVar26 * fVar134 + *pfVar12 * fVar110;
            local_10c8 = pfVar25[1] * fVar134 + pfVar9[1] * fVar110;
            fStack_10c4 = pfVar1[1] * fVar134 + pfVar11[1] * fVar110;
            fStack_10c0 = pfVar5[1] * fVar134 + pfVar10[1] * fVar110;
            fStack_10bc = pfVar26[1] * fVar134 + pfVar12[1] * fVar110;
            fVar66 = pfVar25[2] * fVar134 + pfVar9[2] * fVar110;
            fVar81 = pfVar1[2] * fVar134 + pfVar11[2] * fVar110;
            fVar83 = pfVar5[2] * fVar134 + pfVar10[2] * fVar110;
            fVar85 = pfVar26[2] * fVar134 + pfVar12[2] * fVar110;
            local_1098 = *pfVar30 * fVar134 + *pfVar13 * fVar110;
            fStack_1094 = *pfVar2 * fVar134 + *pfVar15 * fVar110;
            fStack_1090 = fStack_1090 * fVar134 + *pfVar14 * fVar110;
            fStack_108c = fStack_108c * fVar134 + *pfVar16 * fVar110;
            local_10a8 = *pfVar8 * fVar134 + pfVar13[1] * fVar110;
            fStack_10a4 = *pfVar29 * fVar134 + pfVar15[1] * fVar110;
            fStack_10a0 = (float)puVar6[1] * fVar134 + pfVar14[1] * fVar110;
            fStack_109c = (float)puVar27[1] * fVar134 + pfVar16[1] * fVar110;
            local_10d8 = pfVar30[2] * fVar134 + pfVar13[2] * fVar110;
            fStack_10d4 = pfVar2[2] * fVar134 + pfVar15[2] * fVar110;
            fStack_10d0 = (float)puVar6[2] * fVar134 + pfVar14[2] * fVar110;
            fStack_10cc = (float)puVar27[2] * fVar134 + pfVar16[2] * fVar110;
            local_11c8 = *pfVar31 * fVar134 + *pfVar17 * fVar110;
            fStack_11c4 = *pfVar3 * fVar134 + *pfVar19 * fVar110;
            fStack_11c0 = fStack_11c0 * fVar134 + *pfVar18 * fVar110;
            fStack_11bc = fStack_11bc * fVar134 + *pfVar20 * fVar110;
            local_1218 = pfVar31[1] * fVar134 + pfVar17[1] * fVar110;
            fStack_1214 = pfVar3[1] * fVar134 + pfVar19[1] * fVar110;
            fStack_1210 = (float)puVar7[1] * fVar134 + pfVar18[1] * fVar110;
            fStack_120c = (float)puVar28[1] * fVar134 + pfVar20[1] * fVar110;
            local_1258 = pfVar31[2] * fVar134 + pfVar17[2] * fVar110;
            fStack_1254 = pfVar3[2] * fVar134 + pfVar19[2] * fVar110;
            fStack_1250 = fStack_1250 * fVar134 + pfVar18[2] * fVar110;
            fStack_124c = fStack_124c * fVar134 + pfVar20[2] * fVar110;
            local_10b8 = *pfVar32 * fVar134 + *pfVar21 * fVar110;
            fStack_10b4 = *pfVar4 * fVar134 + *pfVar23 * fVar110;
            fStack_10b0 = fStack_10b0 * fVar134 + *pfVar22 * fVar110;
            fStack_10ac = fStack_10ac * fVar134 + *pfVar24 * fVar110;
            fVar96 = pfVar32[1] * fVar134 + pfVar21[1] * fVar110;
            fVar101 = pfVar4[1] * fVar134 + pfVar23[1] * fVar110;
            fVar104 = pfVar8[1] * fVar134 + pfVar22[1] * fVar110;
            fVar107 = pfVar29[1] * fVar134 + pfVar24[1] * fVar110;
            local_11d8 = fVar96;
            fStack_11d4 = fVar101;
            fStack_11d0 = fVar104;
            fStack_11cc = fVar107;
            fVar159 = fVar134 * pfVar32[2] + fVar110 * pfVar21[2];
            fVar160 = fVar134 * pfVar4[2] + fVar110 * pfVar23[2];
            fVar161 = fVar134 * fStack_f80 + fVar110 * pfVar22[2];
            fVar162 = fVar134 * fStack_f7c + fVar110 * pfVar24[2];
            fVar143 = local_10c8 - local_10a8;
            fVar144 = fStack_10c4 - fStack_10a4;
            fVar145 = fStack_10c0 - fStack_10a0;
            fVar146 = fStack_10bc - fStack_109c;
            fVar151 = fVar66 - local_10d8;
            fVar153 = fVar81 - fStack_10d4;
            fVar155 = fVar83 - fStack_10d0;
            fVar157 = fVar85 - fStack_10cc;
            fVar130 = fVar96 - local_10c8;
            fVar135 = fVar101 - fStack_10c4;
            fVar136 = fVar104 - fStack_10c0;
            fVar137 = fVar107 - fStack_10bc;
            fVar138 = fVar159 - fVar66;
            fVar140 = fVar160 - fVar81;
            fVar141 = fVar161 - fVar83;
            fVar142 = fVar162 - fVar85;
            local_10e8 = fVar151 * fVar130 - fVar143 * fVar138;
            fStack_10e4 = fVar153 * fVar135 - fVar144 * fVar140;
            fStack_10e0 = fVar155 * fVar136 - fVar145 * fVar141;
            fStack_10dc = fVar157 * fVar137 - fVar146 * fVar142;
            fVar117 = local_10b8 - fVar65;
            fVar124 = fStack_10b4 - fVar80;
            fVar125 = fStack_10b0 - fVar82;
            fVar126 = fStack_10ac - fVar84;
            fStack_127c = (local_1290->super_RayK<1>).org.field_0.m128[0];
            fVar134 = (local_1290->super_RayK<1>).org.field_0.m128[1];
            fVar110 = (local_1290->super_RayK<1>).org.field_0.m128[2];
            local_1288 = fVar65 - fStack_127c;
            fStack_1284 = fVar80 - fStack_127c;
            fStack_1280 = fVar82 - fStack_127c;
            fStack_127c = fVar84 - fStack_127c;
            local_10c8 = local_10c8 - fVar134;
            fStack_10c4 = fStack_10c4 - fVar134;
            fStack_10c0 = fStack_10c0 - fVar134;
            fStack_10bc = fStack_10bc - fVar134;
            fVar134 = (local_1290->super_RayK<1>).dir.field_0.m128[0];
            fVar150 = (local_1290->super_RayK<1>).dir.field_0.m128[1];
            fVar86 = (local_1290->super_RayK<1>).dir.field_0.m128[2];
            fVar97 = local_1288 * fVar150 - local_10c8 * fVar134;
            fVar102 = fStack_1284 * fVar150 - fStack_10c4 * fVar134;
            fVar105 = fStack_1280 * fVar150 - fStack_10c0 * fVar134;
            fVar108 = fStack_127c * fVar150 - fStack_10bc * fVar134;
            fVar65 = fVar65 - local_1098;
            fVar80 = fVar80 - fStack_1094;
            fVar82 = fVar82 - fStack_1090;
            fVar84 = fVar84 - fStack_108c;
            local_1108[0] = fVar65 * fVar138 - fVar151 * fVar117;
            local_1108[1] = fVar80 * fVar140 - fVar153 * fVar124;
            local_1108[2] = fVar82 * fVar141 - fVar155 * fVar125;
            local_1108[3] = fVar84 * fVar142 - fVar157 * fVar126;
            fVar66 = fVar66 - fVar110;
            fVar81 = fVar81 - fVar110;
            fVar83 = fVar83 - fVar110;
            fVar85 = fVar85 - fVar110;
            fVar110 = fVar66 * fVar134 - local_1288 * fVar86;
            fVar93 = fVar81 * fVar134 - fStack_1284 * fVar86;
            fVar94 = fVar83 * fVar134 - fStack_1280 * fVar86;
            fVar95 = fVar85 * fVar134 - fStack_127c * fVar86;
            local_10f8[0] = fVar143 * fVar117 - fVar65 * fVar130;
            local_10f8[1] = fVar144 * fVar124 - fVar80 * fVar135;
            local_10f8[2] = fVar145 * fVar125 - fVar82 * fVar136;
            local_10f8[3] = fVar146 * fVar126 - fVar84 * fVar137;
            fVar152 = local_10c8 * fVar86 - fVar66 * fVar150;
            fVar154 = fStack_10c4 * fVar86 - fVar81 * fVar150;
            fVar156 = fStack_10c0 * fVar86 - fVar83 * fVar150;
            fVar158 = fStack_10bc * fVar86 - fVar85 * fVar150;
            fVar147 = fVar134 * local_10e8 + fVar150 * local_1108[0] + fVar86 * local_10f8[0];
            fVar148 = fVar134 * fStack_10e4 + fVar150 * local_1108[1] + fVar86 * local_10f8[1];
            fVar149 = fVar134 * fStack_10e0 + fVar150 * local_1108[2] + fVar86 * local_10f8[2];
            fVar150 = fVar134 * fStack_10dc + fVar150 * local_1108[3] + fVar86 * local_10f8[3];
            uVar98 = (uint)fVar147 & 0x80000000;
            uVar103 = (uint)fVar148 & 0x80000000;
            uVar106 = (uint)fVar149 & 0x80000000;
            uVar109 = (uint)fVar150 & 0x80000000;
            local_11a8._0_4_ =
                 (uint)(fVar117 * fVar152 + fVar130 * fVar110 + fVar138 * fVar97) ^ uVar98;
            local_11a8._4_4_ =
                 (uint)(fVar124 * fVar154 + fVar135 * fVar93 + fVar140 * fVar102) ^ uVar103;
            fStack_11a0 = (float)((uint)(fVar125 * fVar156 + fVar136 * fVar94 + fVar141 * fVar105) ^
                                 uVar106);
            fStack_119c = (float)((uint)(fVar126 * fVar158 + fVar137 * fVar95 + fVar142 * fVar108) ^
                                 uVar109);
            local_1198 = (float)((uint)(fVar152 * fVar65 + fVar110 * fVar143 + fVar97 * fVar151) ^
                                uVar98);
            fStack_1194 = (float)((uint)(fVar154 * fVar80 + fVar93 * fVar144 + fVar102 * fVar153) ^
                                 uVar103);
            fStack_1190 = (float)((uint)(fVar156 * fVar82 + fVar94 * fVar145 + fVar105 * fVar155) ^
                                 uVar106);
            fStack_118c = (float)((uint)(fVar158 * fVar84 + fVar95 * fVar146 + fVar108 * fVar157) ^
                                 uVar109);
            fVar134 = ABS(fVar147);
            fVar110 = ABS(fVar148);
            local_1178._0_8_ = CONCAT44(fVar148,fVar147) & 0x7fffffff7fffffff;
            local_1178._8_4_ = ABS(fVar149);
            local_1178._12_4_ = ABS(fVar150);
            auVar139._0_4_ =
                 -(uint)((0.0 <= (float)local_11a8._0_4_ && 0.0 <= local_1198) && fVar147 != 0.0) &
                 local_1008 & -(uint)((float)local_11a8._0_4_ + local_1198 <= fVar134);
            auVar139._4_4_ =
                 -(uint)((0.0 <= (float)local_11a8._4_4_ && 0.0 <= fStack_1194) && fVar148 != 0.0) &
                 uStack_1004 & -(uint)((float)local_11a8._4_4_ + fStack_1194 <= fVar110);
            auVar139._8_4_ =
                 -(uint)((0.0 <= fStack_11a0 && 0.0 <= fStack_1190) && fVar149 != 0.0) & uStack_1000
                 & -(uint)(fStack_11a0 + fStack_1190 <= local_1178._8_4_);
            auVar139._12_4_ =
                 -(uint)((0.0 <= fStack_119c && 0.0 <= fStack_118c) && fVar150 != 0.0) & uStack_ffc
                 & -(uint)(fStack_119c + fStack_118c <= local_1178._12_4_);
            lVar38 = uVar64 + lVar52;
            uVar59 = (undefined4)((ulong)lVar52 >> 0x20);
            uVar48 = movmskps((int)lVar52,auVar139);
            ray = local_1290;
            if (uVar48 != 0) {
              local_1188._0_4_ =
                   uVar98 ^ (uint)(local_1288 * local_10e8 +
                                  local_10c8 * local_1108[0] + fVar66 * local_10f8[0]);
              local_1188._4_4_ =
                   uVar103 ^ (uint)(fStack_1284 * fStack_10e4 +
                                   fStack_10c4 * local_1108[1] + fVar81 * local_10f8[1]);
              fStack_1180 = (float)(uVar106 ^
                                   (uint)(fStack_1280 * fStack_10e0 +
                                         fStack_10c0 * local_1108[2] + fVar83 * local_10f8[2]));
              fStack_117c = (float)(uVar109 ^
                                   (uint)(fStack_127c * fStack_10dc +
                                         fStack_10bc * local_1108[3] + fVar85 * local_10f8[3]));
              fVar150 = (local_1290->super_RayK<1>).org.field_0.m128[3];
              fVar86 = (local_1290->super_RayK<1>).tfar;
              auVar77._0_4_ =
                   -(uint)(fVar150 * fVar134 < (float)local_1188._0_4_ &&
                          (float)local_1188._0_4_ <= fVar86 * fVar134) & auVar139._0_4_;
              auVar77._4_4_ =
                   -(uint)(fVar150 * fVar110 < (float)local_1188._4_4_ &&
                          (float)local_1188._4_4_ <= fVar86 * fVar110) & auVar139._4_4_;
              auVar77._8_4_ =
                   -(uint)(fVar150 * local_1178._8_4_ < fStack_1180 &&
                          fStack_1180 <= fVar86 * local_1178._8_4_) & auVar139._8_4_;
              auVar77._12_4_ =
                   -(uint)(fVar150 * local_1178._12_4_ < fStack_117c &&
                          fStack_117c <= fVar86 * local_1178._12_4_) & auVar139._12_4_;
              uVar48 = movmskps(uVar48,auVar77);
              if (uVar48 != 0) {
                local_1278 = fVar159;
                fStack_1274 = fVar160;
                fStack_1270 = fVar161;
                fStack_126c = fVar162;
                local_1158 = auVar77;
                local_1118._4_4_ = fStack_10e4;
                local_1118._0_4_ = local_10e8;
                fStack_1110 = fStack_10e0;
                fStack_110c = fStack_10dc;
                auVar67 = rcpps(_local_1118,local_1178);
                fVar150 = auVar67._0_4_;
                fVar86 = auVar67._4_4_;
                fVar96 = auVar67._8_4_;
                fVar101 = auVar67._12_4_;
                fVar150 = (1.0 - fVar134 * fVar150) * fVar150 + fVar150;
                fVar86 = (1.0 - fVar110 * fVar86) * fVar86 + fVar86;
                fVar96 = (1.0 - local_1178._8_4_ * fVar96) * fVar96 + fVar96;
                fVar101 = (1.0 - local_1178._12_4_ * fVar101) * fVar101 + fVar101;
                local_1128._0_4_ = (float)local_1188._0_4_ * fVar150;
                local_1128._4_4_ = (float)local_1188._4_4_ * fVar86;
                fStack_1120 = fStack_1180 * fVar96;
                fStack_111c = fStack_117c * fVar101;
                local_1148[0] = (float)local_11a8._0_4_ * fVar150;
                local_1148[1] = (float)local_11a8._4_4_ * fVar86;
                local_1148[2] = fStack_11a0 * fVar96;
                local_1148[3] = fStack_119c * fVar101;
                local_12a8 = auVar77;
                local_1138._4_4_ = fVar86 * fStack_1194;
                local_1138._0_4_ = fVar150 * local_1198;
                fStack_1130 = fVar96 * fStack_1190;
                fStack_112c = fVar101 * fStack_118c;
                auVar111 = blendvps(_DAT_01feb9f0,_local_1128,auVar77);
                auVar114._4_4_ = auVar111._0_4_;
                auVar114._0_4_ = auVar111._4_4_;
                auVar114._8_4_ = auVar111._12_4_;
                auVar114._12_4_ = auVar111._8_4_;
                auVar67 = minps(auVar114,auVar111);
                auVar87._0_8_ = auVar67._8_8_;
                auVar87._8_4_ = auVar67._0_4_;
                auVar87._12_4_ = auVar67._4_4_;
                auVar67 = minps(auVar87,auVar67);
                auVar88._0_8_ =
                     CONCAT44(-(uint)(auVar67._4_4_ == auVar111._4_4_) & auVar77._4_4_,
                              -(uint)(auVar67._0_4_ == auVar111._0_4_) & auVar77._0_4_);
                auVar88._8_4_ = -(uint)(auVar67._8_4_ == auVar111._8_4_) & auVar77._8_4_;
                auVar88._12_4_ = -(uint)(auVar67._12_4_ == auVar111._12_4_) & auVar77._12_4_;
                iVar49 = movmskps(uVar48,auVar88);
                if (iVar49 != 0) {
                  auVar77._8_4_ = auVar88._8_4_;
                  auVar77._0_8_ = auVar88._0_8_;
                  auVar77._12_4_ = auVar88._12_4_;
                }
                uVar50 = movmskps(iVar49,auVar77);
                piVar55 = (int *)0x0;
                if (CONCAT44(uVar59,uVar50) != 0) {
                  for (; (CONCAT44(uVar59,uVar50) >> (long)piVar55 & 1) == 0;
                      piVar55 = (int *)((long)piVar55 + 1)) {
                  }
                }
LAB_00e83120:
                fVar107 = fStack_11cc;
                fVar104 = fStack_11d0;
                fVar101 = fStack_11d4;
                fVar96 = local_11d8;
                uVar48 = *(uint *)(lVar38 + 0x40 + (long)piVar55 * 4);
                pRVar53 = (RayHit *)(ulong)uVar48;
                pGVar37 = (pSVar54->geometries).items[(long)pRVar53].ptr;
                if ((pGVar37->mask & (ray->super_RayK<1>).mask) == 0) {
                  *(undefined4 *)(local_12a8 + (long)piVar55 * 4) = 0;
LAB_00e83303:
                  uVar59 = (undefined4)((ulong)pRVar53 >> 0x20);
                  uVar48 = movmskps((int)pRVar53,local_12a8);
                  if (uVar48 == 0) goto LAB_00e837e6;
                  BVHNIntersector1<4,16777232,false,embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Moeller<4,true>>>
                  ::intersect();
                  piVar55 = local_1248.valid;
                  goto LAB_00e83120;
                }
                pRVar41 = context->args;
                if ((pRVar41->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar37->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_1248.context = context->user;
                  local_1208 = local_1108[(long)(piVar55 + -1)];
                  local_1204 = local_1108[(long)piVar55];
                  local_1200 = local_10f8[(long)piVar55];
                  local_11fc = local_1148[(long)piVar55];
                  local_11f8 = *(undefined4 *)(local_1138 + (long)piVar55 * 4);
                  local_11f4 = *(undefined4 *)(lVar38 + 0x50 + (long)piVar55 * 4);
                  local_11f0 = uVar48;
                  local_11ec = (local_1248.context)->instID[0];
                  local_11e8 = (local_1248.context)->instPrimID[0];
                  local_1288 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_1128 + (long)piVar55 * 4);
                  local_12ac = -1;
                  local_1248.valid = &local_12ac;
                  local_1248.geometryUserPtr = pGVar37->userPtr;
                  local_1248.ray = (RTCRayN *)ray;
                  local_1248.hit = (RTCHitN *)&local_1208;
                  local_1248.N = 1;
                  if ((pGVar37->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar37->intersectionFilterN)(&local_1248), *local_1248.valid != 0)) {
                    if (pRVar41->filter != (RTCFilterFunctionN)0x0) {
                      if (((pRVar41->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar37->field_8).field_0x2 & 0x40) != 0)) {
                        (*pRVar41->filter)(&local_1248);
                      }
                      if (*local_1248.valid == 0) goto LAB_00e83341;
                    }
                    (((Vec3f *)((long)local_1248.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_1248.hit;
                    (((Vec3f *)((long)local_1248.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_1248.hit + 4);
                    (((Vec3f *)((long)local_1248.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_1248.hit + 8);
                    *(float *)((long)local_1248.ray + 0x3c) = *(float *)(local_1248.hit + 0xc);
                    *(float *)((long)local_1248.ray + 0x40) = *(float *)(local_1248.hit + 0x10);
                    *(float *)((long)local_1248.ray + 0x44) = *(float *)(local_1248.hit + 0x14);
                    *(float *)((long)local_1248.ray + 0x48) = *(float *)(local_1248.hit + 0x18);
                    *(float *)((long)local_1248.ray + 0x4c) = *(float *)(local_1248.hit + 0x1c);
                    *(float *)((long)local_1248.ray + 0x50) = *(float *)(local_1248.hit + 0x20);
                    pRVar53 = (RayHit *)local_1248.ray;
                  }
                  else {
LAB_00e83341:
                    (local_1290->super_RayK<1>).tfar = local_1288;
                    pRVar53 = local_1290;
                  }
                  *(undefined4 *)(local_12a8 + (long)piVar55 * 4) = 0;
                  fVar134 = (local_1290->super_RayK<1>).tfar;
                  local_12a8._0_4_ = -(uint)((float)local_1128._0_4_ <= fVar134) & local_12a8._0_4_;
                  local_12a8._4_4_ = -(uint)((float)local_1128._4_4_ <= fVar134) & local_12a8._4_4_;
                  local_12a8._8_4_ = -(uint)(fStack_1120 <= fVar134) & local_12a8._8_4_;
                  local_12a8._12_4_ = -(uint)(fStack_111c <= fVar134) & local_12a8._12_4_;
                  pSVar54 = local_1260;
                  ray = local_1290;
                  fVar96 = local_11d8;
                  fVar101 = fStack_11d4;
                  fVar104 = fStack_11d0;
                  fVar107 = fStack_11cc;
                  goto LAB_00e83303;
                }
                fVar134 = local_1148[(long)piVar55];
                fVar110 = *(float *)(local_1138 + (long)piVar55 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_1128 + (long)piVar55 * 4);
                (ray->Ng).field_0.field_0.x = local_1108[(long)(piVar55 + -1)];
                (ray->Ng).field_0.field_0.y = local_1108[(long)piVar55];
                (ray->Ng).field_0.field_0.z = local_10f8[(long)piVar55];
                ray->u = fVar134;
                ray->v = fVar110;
                ray->primID = *(uint *)(lVar38 + 0x50 + (long)piVar55 * 4);
                ray->geomID = uVar48;
                pRVar42 = context->user;
                ray->instID[0] = pRVar42->instID[0];
                uVar48 = pRVar42->instPrimID[0];
                uVar59 = 0;
                ray->instPrimID[0] = uVar48;
LAB_00e837e6:
                fVar159 = local_1278;
                fVar160 = fStack_1274;
                fVar161 = fStack_1270;
                fVar162 = fStack_126c;
              }
            }
            local_1278 = local_11c8 - local_10b8;
            fStack_1274 = fStack_11c4 - fStack_10b4;
            fStack_1270 = fStack_11c0 - fStack_10b0;
            fStack_126c = fStack_11bc - fStack_10ac;
            fVar96 = local_1218 - fVar96;
            fVar101 = fStack_1214 - fVar101;
            fVar104 = fStack_1210 - fVar104;
            fVar107 = fStack_120c - fVar107;
            local_1288 = local_1258 - fVar159;
            fStack_1284 = fStack_1254 - fVar160;
            fStack_1280 = fStack_1250 - fVar161;
            fStack_127c = fStack_124c - fVar162;
            fVar161 = local_1098 - local_11c8;
            fVar162 = fStack_1094 - fStack_11c4;
            fVar65 = fStack_1090 - fStack_11c0;
            fVar66 = fStack_108c - fStack_11bc;
            fVar136 = local_10a8 - local_1218;
            fVar137 = fStack_10a4 - fStack_1214;
            fVar138 = fStack_10a0 - fStack_1210;
            fVar140 = fStack_109c - fStack_120c;
            fVar125 = local_10d8 - local_1258;
            fVar126 = fStack_10d4 - fStack_1254;
            fVar130 = fStack_10d0 - fStack_1250;
            fVar135 = fStack_10cc - fStack_124c;
            local_1118._0_4_ = fVar136 * local_1288 - fVar125 * fVar96;
            local_1118._4_4_ = fVar137 * fStack_1284 - fVar126 * fVar101;
            fStack_1110 = fVar138 * fStack_1280 - fVar130 * fVar104;
            fStack_110c = fVar140 * fStack_127c - fVar135 * fVar107;
            local_1108[0] = fVar125 * local_1278 - fVar161 * local_1288;
            local_1108[1] = fVar126 * fStack_1274 - fVar162 * fStack_1284;
            local_1108[2] = fVar130 * fStack_1270 - fVar65 * fStack_1280;
            local_1108[3] = fVar135 * fStack_126c - fVar66 * fStack_127c;
            local_10f8[0] = fVar161 * fVar96 - fVar136 * local_1278;
            local_10f8[1] = fVar162 * fVar101 - fVar137 * fStack_1274;
            local_10f8[2] = fVar65 * fVar104 - fVar138 * fStack_1270;
            local_10f8[3] = fVar66 * fVar107 - fVar140 * fStack_126c;
            fVar134 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar110 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar150 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar86 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar159 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar160 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_11c8 = local_11c8 - fVar134;
            fStack_11c4 = fStack_11c4 - fVar134;
            fStack_11c0 = fStack_11c0 - fVar134;
            fStack_11bc = fStack_11bc - fVar134;
            local_1218 = local_1218 - fVar110;
            fStack_1214 = fStack_1214 - fVar110;
            fStack_1210 = fStack_1210 - fVar110;
            fStack_120c = fStack_120c - fVar110;
            local_1258 = local_1258 - fVar150;
            fStack_1254 = fStack_1254 - fVar150;
            fStack_1250 = fStack_1250 - fVar150;
            fStack_124c = fStack_124c - fVar150;
            fVar80 = local_1218 * fVar160 - local_1258 * fVar159;
            fVar81 = fStack_1214 * fVar160 - fStack_1254 * fVar159;
            fVar82 = fStack_1210 * fVar160 - fStack_1250 * fVar159;
            fVar83 = fStack_120c * fVar160 - fStack_124c * fVar159;
            fVar105 = local_1258 * fVar86 - local_11c8 * fVar160;
            fVar108 = fStack_1254 * fVar86 - fStack_11c4 * fVar160;
            fVar117 = fStack_1250 * fVar86 - fStack_11c0 * fVar160;
            fVar124 = fStack_124c * fVar86 - fStack_11bc * fVar160;
            fVar84 = local_11c8 * fVar159 - local_1218 * fVar86;
            fVar85 = fStack_11c4 * fVar159 - fStack_1214 * fVar86;
            fVar93 = fStack_11c0 * fVar159 - fStack_1210 * fVar86;
            fVar94 = fStack_11bc * fVar159 - fStack_120c * fVar86;
            fVar95 = fVar86 * (float)local_1118._0_4_ +
                     fVar159 * local_1108[0] + fVar160 * local_10f8[0];
            fVar97 = fVar86 * (float)local_1118._4_4_ +
                     fVar159 * local_1108[1] + fVar160 * local_10f8[1];
            fVar102 = fVar86 * fStack_1110 + fVar159 * local_1108[2] + fVar160 * local_10f8[2];
            fVar159 = fVar86 * fStack_110c + fVar159 * local_1108[3] + fVar160 * local_10f8[3];
            uVar98 = (uint)fVar95 & 0x80000000;
            uVar103 = (uint)fVar97 & 0x80000000;
            uVar106 = (uint)fVar102 & 0x80000000;
            uVar109 = (uint)fVar159 & 0x80000000;
            fVar134 = (float)((uint)(fVar161 * fVar80 + fVar136 * fVar105 + fVar125 * fVar84) ^
                             uVar98);
            fVar110 = (float)((uint)(fVar162 * fVar81 + fVar137 * fVar108 + fVar126 * fVar85) ^
                             uVar103);
            fVar150 = (float)((uint)(fVar65 * fVar82 + fVar138 * fVar117 + fVar130 * fVar93) ^
                             uVar106);
            fVar86 = (float)((uint)(fVar66 * fVar83 + fVar140 * fVar124 + fVar135 * fVar94) ^
                            uVar109);
            auVar113._0_4_ =
                 (float)((uint)(fVar80 * local_1278 + fVar105 * fVar96 + fVar84 * local_1288) ^
                        uVar98);
            auVar113._4_4_ =
                 (float)((uint)(fVar81 * fStack_1274 + fVar108 * fVar101 + fVar85 * fStack_1284) ^
                        uVar103);
            auVar113._8_4_ =
                 (float)((uint)(fVar82 * fStack_1270 + fVar117 * fVar104 + fVar93 * fStack_1280) ^
                        uVar106);
            auVar113._12_4_ =
                 (float)((uint)(fVar83 * fStack_126c + fVar124 * fVar107 + fVar94 * fStack_127c) ^
                        uVar109);
            fVar96 = ABS(fVar95);
            fVar101 = ABS(fVar97);
            local_1178._0_8_ = CONCAT44(fVar97,fVar95) & 0x7fffffff7fffffff;
            local_1178._8_4_ = ABS(fVar102);
            local_1178._12_4_ = ABS(fVar159);
            auVar133._0_4_ =
                 -(uint)((0.0 <= fVar134 && 0.0 <= auVar113._0_4_) && fVar95 != 0.0) & local_1008 &
                 -(uint)(fVar134 + auVar113._0_4_ <= fVar96);
            auVar133._4_4_ =
                 -(uint)((0.0 <= fVar110 && 0.0 <= auVar113._4_4_) && fVar97 != 0.0) & uStack_1004 &
                 -(uint)(fVar110 + auVar113._4_4_ <= fVar101);
            auVar133._8_4_ =
                 -(uint)((0.0 <= fVar150 && 0.0 <= auVar113._8_4_) && fVar102 != 0.0) & uStack_1000
                 & -(uint)(fVar150 + auVar113._8_4_ <= local_1178._8_4_);
            auVar133._12_4_ =
                 -(uint)((0.0 <= fVar86 && 0.0 <= auVar113._12_4_) && fVar159 != 0.0) & uStack_ffc &
                 -(uint)(fVar86 + auVar113._12_4_ <= local_1178._12_4_);
            iVar49 = movmskps(uVar48,auVar133);
            in_R10 = local_11b0;
            if (iVar49 != 0) {
              local_1188._0_4_ =
                   uVar98 ^ (uint)(local_11c8 * (float)local_1118._0_4_ +
                                  local_1218 * local_1108[0] + local_1258 * local_10f8[0]);
              local_1188._4_4_ =
                   uVar103 ^ (uint)(fStack_11c4 * (float)local_1118._4_4_ +
                                   fStack_1214 * local_1108[1] + fStack_1254 * local_10f8[1]);
              fStack_1180 = (float)(uVar106 ^
                                   (uint)(fStack_11c0 * fStack_1110 +
                                         fStack_1210 * local_1108[2] + fStack_1250 * local_10f8[2]))
              ;
              fStack_117c = (float)(uVar109 ^
                                   (uint)(fStack_11bc * fStack_110c +
                                         fStack_120c * local_1108[3] + fStack_124c * local_10f8[3]))
              ;
              fVar104 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar107 = (ray->super_RayK<1>).tfar;
              auVar78._0_4_ =
                   -(uint)(fVar104 * fVar96 < (float)local_1188._0_4_ &&
                          (float)local_1188._0_4_ <= fVar107 * fVar96) & auVar133._0_4_;
              auVar78._4_4_ =
                   -(uint)(fVar104 * fVar101 < (float)local_1188._4_4_ &&
                          (float)local_1188._4_4_ <= fVar107 * fVar101) & auVar133._4_4_;
              auVar78._8_4_ =
                   -(uint)(fVar104 * local_1178._8_4_ < fStack_1180 &&
                          fStack_1180 <= fVar107 * local_1178._8_4_) & auVar133._8_4_;
              auVar78._12_4_ =
                   -(uint)(fVar104 * local_1178._12_4_ < fStack_117c &&
                          fStack_117c <= fVar107 * local_1178._12_4_) & auVar133._12_4_;
              iVar49 = movmskps(iVar49,auVar78);
              if (iVar49 != 0) {
                local_1158 = auVar78;
                local_11a8._4_4_ = fVar101 - fVar110;
                local_11a8._0_4_ = fVar96 - fVar134;
                fStack_11a0 = local_1178._8_4_ - fVar150;
                fStack_119c = local_1178._12_4_ - fVar86;
                fStack_1194 = fVar101 - auVar113._4_4_;
                local_1198 = fVar96 - auVar113._0_4_;
                fStack_1190 = local_1178._8_4_ - auVar113._8_4_;
                fStack_118c = local_1178._12_4_ - auVar113._12_4_;
                local_12a8 = auVar78;
                auVar67 = rcpps(auVar113,local_1178);
                fVar104 = auVar67._0_4_;
                fVar107 = auVar67._4_4_;
                fVar159 = auVar67._8_4_;
                fVar160 = auVar67._12_4_;
                fVar104 = (1.0 - fVar96 * fVar104) * fVar104 + fVar104;
                fVar107 = (1.0 - fVar101 * fVar107) * fVar107 + fVar107;
                fVar159 = (1.0 - local_1178._8_4_ * fVar159) * fVar159 + fVar159;
                fVar160 = (1.0 - local_1178._12_4_ * fVar160) * fVar160 + fVar160;
                local_1128._0_4_ = (float)local_1188._0_4_ * fVar104;
                local_1128._4_4_ = (float)local_1188._4_4_ * fVar107;
                fStack_1120 = fStack_1180 * fVar159;
                fStack_111c = fStack_117c * fVar160;
                local_1148[0] = (fVar96 - fVar134) * fVar104;
                local_1148[1] = (fVar101 - fVar110) * fVar107;
                local_1148[2] = (local_1178._8_4_ - fVar150) * fVar159;
                local_1148[3] = (local_1178._12_4_ - fVar86) * fVar160;
                local_1138._0_4_ = fVar104 * (fVar96 - auVar113._0_4_);
                local_1138._4_4_ = fVar107 * (fVar101 - auVar113._4_4_);
                fStack_1130 = fVar159 * (local_1178._8_4_ - auVar113._8_4_);
                fStack_112c = fVar160 * (local_1178._12_4_ - auVar113._12_4_);
                auVar111 = blendvps(_DAT_01feb9f0,_local_1128,auVar78);
                auVar115._4_4_ = auVar111._0_4_;
                auVar115._0_4_ = auVar111._4_4_;
                auVar115._8_4_ = auVar111._12_4_;
                auVar115._12_4_ = auVar111._8_4_;
                auVar67 = minps(auVar115,auVar111);
                auVar89._0_8_ = auVar67._8_8_;
                auVar89._8_4_ = auVar67._0_4_;
                auVar89._12_4_ = auVar67._4_4_;
                auVar67 = minps(auVar89,auVar67);
                auVar90._0_8_ =
                     CONCAT44(-(uint)(auVar67._4_4_ == auVar111._4_4_) & auVar78._4_4_,
                              -(uint)(auVar67._0_4_ == auVar111._0_4_) & auVar78._0_4_);
                auVar90._8_4_ = -(uint)(auVar67._8_4_ == auVar111._8_4_) & auVar78._8_4_;
                auVar90._12_4_ = -(uint)(auVar67._12_4_ == auVar111._12_4_) & auVar78._12_4_;
                iVar49 = movmskps(iVar49,auVar90);
                if (iVar49 != 0) {
                  auVar78._8_4_ = auVar90._8_4_;
                  auVar78._0_8_ = auVar90._0_8_;
                  auVar78._12_4_ = auVar90._12_4_;
                }
                uVar50 = movmskps(iVar49,auVar78);
                lVar52 = 0;
                pSVar54 = local_1260;
                if (CONCAT44(uVar59,uVar50) != 0) {
                  for (; (CONCAT44(uVar59,uVar50) >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
                  }
                }
LAB_00e834e8:
                uVar48 = *(uint *)(lVar38 + 0x40 + lVar52 * 4);
                pRVar53 = (RayHit *)(ulong)uVar48;
                pGVar37 = (pSVar54->geometries).items[(long)pRVar53].ptr;
                if ((pGVar37->mask & (ray->super_RayK<1>).mask) == 0) {
                  *(undefined4 *)(local_12a8 + lVar52 * 4) = 0;
                }
                else {
                  pRVar41 = context->args;
                  if ((pRVar41->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar37->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar134 = local_1148[lVar52];
                    fVar110 = *(float *)(local_1138 + lVar52 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1128 + lVar52 * 4);
                    (ray->Ng).field_0.field_0.x = local_1108[lVar52 + -4];
                    (ray->Ng).field_0.field_0.y = local_1108[lVar52];
                    (ray->Ng).field_0.field_0.z = local_10f8[lVar52];
                    ray->u = fVar134;
                    ray->v = fVar110;
                    ray->primID = *(uint *)(lVar38 + 0x50 + lVar52 * 4);
                    ray->geomID = uVar48;
                    pRVar42 = context->user;
                    ray->instID[0] = pRVar42->instID[0];
                    ray->instPrimID[0] = pRVar42->instPrimID[0];
                    goto LAB_00e82fc1;
                  }
                  local_1248.context = context->user;
                  local_1208 = local_1108[lVar52 + -4];
                  local_1204 = local_1108[lVar52];
                  local_1200 = local_10f8[lVar52];
                  local_11fc = local_1148[lVar52];
                  local_11f8 = *(undefined4 *)(local_1138 + lVar52 * 4);
                  local_11f4 = *(undefined4 *)(lVar38 + 0x50 + lVar52 * 4);
                  local_11f0 = uVar48;
                  local_11ec = (local_1248.context)->instID[0];
                  local_11e8 = (local_1248.context)->instPrimID[0];
                  local_1258 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_1128 + lVar52 * 4);
                  local_12ac = -1;
                  local_1248.valid = &local_12ac;
                  local_1248.geometryUserPtr = pGVar37->userPtr;
                  local_1248.ray = (RTCRayN *)ray;
                  local_1248.hit = (RTCHitN *)&local_1208;
                  local_1248.N = 1;
                  if ((pGVar37->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar37->intersectionFilterN)(&local_1248), *local_1248.valid != 0)) {
                    if (pRVar41->filter != (RTCFilterFunctionN)0x0) {
                      if (((pRVar41->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar37->field_8).field_0x2 & 0x40) != 0)) {
                        (*pRVar41->filter)(&local_1248);
                      }
                      if (*local_1248.valid == 0) goto LAB_00e8371c;
                    }
                    (((Vec3f *)((long)local_1248.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_1248.hit;
                    (((Vec3f *)((long)local_1248.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_1248.hit + 4);
                    (((Vec3f *)((long)local_1248.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_1248.hit + 8);
                    *(float *)((long)local_1248.ray + 0x3c) = *(float *)(local_1248.hit + 0xc);
                    *(float *)((long)local_1248.ray + 0x40) = *(float *)(local_1248.hit + 0x10);
                    *(float *)((long)local_1248.ray + 0x44) = *(float *)(local_1248.hit + 0x14);
                    *(float *)((long)local_1248.ray + 0x48) = *(float *)(local_1248.hit + 0x18);
                    *(float *)((long)local_1248.ray + 0x4c) = *(float *)(local_1248.hit + 0x1c);
                    *(float *)((long)local_1248.ray + 0x50) = *(float *)(local_1248.hit + 0x20);
                    pRVar53 = (RayHit *)local_1248.ray;
                  }
                  else {
LAB_00e8371c:
                    (local_1290->super_RayK<1>).tfar = local_1258;
                    pRVar53 = local_1290;
                  }
                  *(undefined4 *)(local_12a8 + lVar52 * 4) = 0;
                  fVar134 = (local_1290->super_RayK<1>).tfar;
                  local_12a8._4_4_ = -(uint)((float)local_1128._4_4_ <= fVar134) & local_12a8._4_4_;
                  local_12a8._0_4_ = -(uint)((float)local_1128._0_4_ <= fVar134) & local_12a8._0_4_;
                  local_12a8._8_4_ = -(uint)(fStack_1120 <= fVar134) & local_12a8._8_4_;
                  local_12a8._12_4_ = -(uint)(fStack_111c <= fVar134) & local_12a8._12_4_;
                  pSVar54 = local_1260;
                  in_R10 = local_11b0;
                  ray = local_1290;
                }
                iVar49 = movmskps((int)pRVar53,local_12a8);
                if (iVar49 == 0) goto LAB_00e82fc1;
                auVar111 = blendvps(_DAT_01feb9f0,_local_1128,local_12a8);
                auVar116._4_4_ = auVar111._0_4_;
                auVar116._0_4_ = auVar111._4_4_;
                auVar116._8_4_ = auVar111._12_4_;
                auVar116._12_4_ = auVar111._8_4_;
                auVar67 = minps(auVar116,auVar111);
                auVar91._0_8_ = auVar67._8_8_;
                auVar91._8_4_ = auVar67._0_4_;
                auVar91._12_4_ = auVar67._4_4_;
                auVar67 = minps(auVar91,auVar67);
                auVar92._0_8_ =
                     CONCAT44(-(uint)(auVar67._4_4_ == auVar111._4_4_) & local_12a8._4_4_,
                              -(uint)(auVar67._0_4_ == auVar111._0_4_) & local_12a8._0_4_);
                auVar92._8_4_ = -(uint)(auVar67._8_4_ == auVar111._8_4_) & local_12a8._8_4_;
                auVar92._12_4_ = -(uint)(auVar67._12_4_ == auVar111._12_4_) & local_12a8._12_4_;
                iVar49 = movmskps(iVar49,auVar92);
                auVar79 = local_12a8;
                if (iVar49 != 0) {
                  auVar79._8_4_ = auVar92._8_4_;
                  auVar79._0_8_ = auVar92._0_8_;
                  auVar79._12_4_ = auVar92._12_4_;
                }
                uVar59 = movmskps(iVar49,auVar79);
                uVar51 = CONCAT44((int)((ulong)pRVar53 >> 0x20),uVar59);
                lVar52 = 0;
                if (uVar51 != 0) {
                  for (; (uVar51 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
                  }
                }
                goto LAB_00e834e8;
              }
            }
LAB_00e82fc1:
            local_1010 = local_1010 + 1;
          } while (local_1010 != local_1088);
        }
        fVar134 = (ray->super_RayK<1>).tfar;
        auVar111._4_4_ = fVar134;
        auVar111._0_4_ = fVar134;
        auVar111._8_4_ = fVar134;
        auVar111._12_4_ = fVar134;
        fVar134 = local_fc8;
        fVar110 = fStack_fc4;
        fVar150 = fStack_fc0;
        fVar86 = fStack_fbc;
        fVar96 = local_fd8;
        fVar101 = fStack_fd4;
        fVar104 = fStack_fd0;
        fVar107 = fStack_fcc;
        fVar159 = local_fe8;
        fVar160 = fStack_fe4;
        fVar161 = fStack_fe0;
        fVar162 = fStack_fdc;
        fVar65 = local_ff8;
        fVar66 = fStack_ff4;
        fVar80 = fStack_ff0;
        fVar81 = fStack_fec;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }